

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fBlendTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::BlendCase::BlendCase
          (BlendCase *this,Context *context,char *name,char *desc,
          vector<deqp::gles2::Functional::BlendParams,_std::allocator<deqp::gles2::Functional::BlendParams>_>
          *paramSets)

{
  gles2::TestCase::TestCase(&this->super_TestCase,context,name,desc);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__BlendCase_01e153c0;
  std::
  vector<deqp::gles2::Functional::BlendParams,_std::allocator<deqp::gles2::Functional::BlendParams>_>
  ::vector(&this->m_paramSets,paramSets);
  this->m_curParamSetNdx = 0;
  this->m_renderer = (QuadRenderer *)0x0;
  this->m_referenceRenderer = (ReferenceQuadRenderer *)0x0;
  this->m_refColorBuffer = (TextureLevel *)0x0;
  deqp::gls::FragmentOpUtil::Quad::Quad(&this->m_firstQuad);
  deqp::gls::FragmentOpUtil::Quad::Quad(&this->m_secondQuad);
  deqp::gls::FragmentOpUtil::IntegerQuad::IntegerQuad(&this->m_firstQuadInt);
  deqp::gls::FragmentOpUtil::IntegerQuad::IntegerQuad(&this->m_secondQuadInt);
  this->m_viewportW = 0;
  this->m_viewportH = 0;
  return;
}

Assistant:

BlendCase::BlendCase (Context&						context,
					  const char*					name,
					  const char*					desc,
					  const vector<BlendParams>&	paramSets)
	: TestCase				(context, name, desc)
	, m_paramSets			(paramSets)
	, m_curParamSetNdx		(0)
	, m_renderer			(DE_NULL)
	, m_referenceRenderer	(DE_NULL)
	, m_refColorBuffer		(DE_NULL)
	, m_viewportW			(0)
	, m_viewportH			(0)
{
	DE_ASSERT(!m_paramSets.empty());
	for (int i = 0; i < (int)m_paramSets.size(); i++)
		DE_ASSERT(m_paramSets[i].dstFuncRGB != GL_SRC_ALPHA_SATURATE && m_paramSets[i].dstFuncAlpha != GL_SRC_ALPHA_SATURATE);
}